

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_portals.cxx
# Opt level: O2

void __thiscall xray_re::xr_scene_portals::save_v12(xr_scene_portals *this,xr_ini_writer *w)

{
  size_t in_RCX;
  
  xr_ini_writer::open_section(w,"main");
  xr_ini_writer::write(w,0x1c66ca,(void *)(ulong)this->m_flags,in_RCX);
  xr_ini_writer::write
            (w,0x1d19dd,
             (void *)((long)(this->super_xr_scene_objects).m_objects.
                            super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->super_xr_scene_objects).m_objects.
                            super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3),in_RCX);
  xr_ini_writer::write(w,0x1d3f45,(void *)0x0,in_RCX);
  xr_ini_writer::close_section(w);
  xr_scene::write_revision((this->super_xr_scene_objects).super_xr_scene_part.m_scene,w,true);
  xr_scene_objects::save_v12(&this->super_xr_scene_objects,w);
  return;
}

Assistant:

void xr_scene_portals::save_v12(xr_ini_writer* w) const
{
	w->open_section("main");
	w->write("flags", this->m_flags);
	w->write("objects_count", this->objects().size());
	w->write("version", 0);
	w->close_section();

	scene().write_revision(w);

	xr_scene_objects::save_v12(w);
}